

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_ssim.cpp
# Opt level: O2

void basisu::gaussian_filter
               (imagef *dst,imagef *orig_img,uint32_t odd_filter_width,float sigma_sqr,bool wrapping
               ,uint32_t width_divisor,uint32_t height_divisor)

{
  float fVar1;
  uint h;
  uint32_t y;
  float *pfVar2;
  vec4F *pvVar3;
  int iVar4;
  uint32_t x;
  uint w;
  uint uVar5;
  uint32_t x_00;
  int iVar6;
  vec4F c;
  vector2D<float> kernel;
  
  if ((odd_filter_width & 1) != 0) {
    vector2D<float>::vector2D(&kernel,odd_filter_width,odd_filter_width);
    pfVar2 = vector2D<float>::get_ptr(&kernel);
    compute_gaussian_kernel(pfVar2,odd_filter_width,odd_filter_width,sigma_sqr,1);
    w = orig_img->m_width / width_divisor;
    h = orig_img->m_height / height_divisor;
    c.m_v[0] = 0.0;
    c.m_v[1] = 0.0;
    c.m_v[2] = 0.0;
    c.m_v[3] = 1.0;
    imagef::crop(dst,w,h,0xffffffff,&c);
    uVar5 = odd_filter_width >> 1;
    for (y = 0; (int)y < (int)h; y = y + 1) {
      iVar6 = (width_divisor >> 1) - uVar5;
      for (x = 0; (int)x < (int)w; x = x + 1) {
        vec<4U,_float>::set(&c,0.0);
        for (iVar4 = -uVar5; iVar4 != uVar5 + 1; iVar4 = iVar4 + 1) {
          for (x_00 = 0; uVar5 * 2 + 1 != x_00; x_00 = x_00 + 1) {
            pvVar3 = imagef::get_clamped_or_wrapped
                               (orig_img,iVar6 + x_00,
                                y * height_divisor + (height_divisor >> 1) + iVar4,wrapping,wrapping
                               );
            pfVar2 = vector2D<float>::operator()(&kernel,x_00,iVar4 + uVar5);
            fVar1 = *pfVar2;
            c.m_v[0] = fVar1 * pvVar3->m_v[0] + c.m_v[0];
            c.m_v[1] = fVar1 * pvVar3->m_v[1] + c.m_v[1];
            c.m_v[2] = fVar1 * pvVar3->m_v[2] + c.m_v[2];
            c.m_v[3] = fVar1 * pvVar3->m_v[3] + c.m_v[3];
          }
        }
        pvVar3 = imagef::operator()(dst,x,y);
        pvVar3->m_v[0] = c.m_v[0];
        pvVar3->m_v[1] = c.m_v[1];
        pvVar3->m_v[2] = c.m_v[2];
        pvVar3->m_v[3] = c.m_v[3];
        iVar6 = iVar6 + width_divisor;
      }
    }
    free(kernel.m_values.m_p);
    return;
  }
  __assert_fail("odd_filter_width && (odd_filter_width & 1)",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_ssim.cpp"
                ,0x5e,
                "void basisu::gaussian_filter(imagef &, const imagef &, uint32_t, float, bool, uint32_t, uint32_t)"
               );
}

Assistant:

void gaussian_filter(imagef &dst, const imagef &orig_img, uint32_t odd_filter_width, float sigma_sqr, bool wrapping, uint32_t width_divisor, uint32_t height_divisor)
	{
		assert(odd_filter_width && (odd_filter_width & 1));
		odd_filter_width |= 1;

		vector2D<float> kernel(odd_filter_width, odd_filter_width);
		compute_gaussian_kernel(kernel.get_ptr(), odd_filter_width, odd_filter_width, sigma_sqr, cComputeGaussianFlagNormalize);

		const int dst_width = orig_img.get_width() / width_divisor;
		const int dst_height = orig_img.get_height() / height_divisor;

		const int H = odd_filter_width / 2;
		const int L = -H;

		dst.crop(dst_width, dst_height);

//#pragma omp parallel for
		for (int oy = 0; oy < dst_height; oy++)
		{
			for (int ox = 0; ox < dst_width; ox++)
			{
				vec4F c(0.0f);

				for (int yd = L; yd <= H; yd++)
				{
					int y = oy * height_divisor + (height_divisor >> 1) + yd;

					for (int xd = L; xd <= H; xd++)
					{
						int x = ox * width_divisor + (width_divisor >> 1) + xd;

						const vec4F &p = orig_img.get_clamped_or_wrapped(x, y, wrapping, wrapping);

						float w = kernel(xd + H, yd + H);
						c[0] += p[0] * w;
						c[1] += p[1] * w;
						c[2] += p[2] * w;
						c[3] += p[3] * w;
					}
				}

				dst(ox, oy).set(c[0], c[1], c[2], c[3]);
			}
		}
	}